

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O1

int run_test_part(char *test,char *part)

{
  int iVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  char **ppcVar2;
  
  if (TASKS[0].main != (_func_int *)0x0) {
    ppcVar2 = &TASKS[0].process_name;
    UNRECOVERED_JUMPTABLE = TASKS[0].main;
    do {
      iVar1 = strcmp(test,((task_entry_t *)(ppcVar2 + -1))->task_name);
      if (iVar1 == 0) {
        iVar1 = strcmp(part,*ppcVar2);
        if (iVar1 == 0) {
          iVar1 = (*UNRECOVERED_JUMPTABLE)();
          return iVar1;
        }
      }
      UNRECOVERED_JUMPTABLE = (_func_int *)ppcVar2[6];
      ppcVar2 = ppcVar2 + 5;
    } while (UNRECOVERED_JUMPTABLE != (_func_int *)0x0);
  }
  fprintf(_stdout,"No test part with that name: %s:%s\n",test,part);
  fflush(_stdout);
  return 0xff;
}

Assistant:

int run_test_part(const char* test, const char* part) {
  task_entry_t* task;
  int r;

  for (task = TASKS; task->main; task++) {
    if (strcmp(test, task->task_name) == 0 &&
        strcmp(part, task->process_name) == 0) {
      r = task->main();
      return r;
    }
  }

  fprintf(stdout, "No test part with that name: %s:%s\n", test, part);
  fflush(stdout);
  return 255;
}